

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O0

bool __thiscall DVideoModeMenu::Responder(DVideoModeMenu *this,event_t *ev)

{
  bool bVar1;
  int iVar2;
  float volume;
  FSoundID local_24;
  event_t *local_20;
  event_t *ev_local;
  DVideoModeMenu *this_local;
  
  local_20 = ev;
  ev_local = (event_t *)this;
  if (((ev->type == '\x04') && (ev->subtype == '\x01')) &&
     ((ev->data1 == 0x74 || (ev->data1 == 0x54)))) {
    bVar1 = GetSelectedSize(&NewWidth,&NewHeight);
    if (bVar1) {
      OldWidth = screen->VideoWidth;
      OldHeight = screen->VideoHeight;
      OldBits = DisplayBits;
      iVar2 = FIntCVar::operator_cast_to_int(&DummyDepthCvar);
      NewBits = (int)BitTranslate[iVar2];
      setmodeneeded = true;
      iVar2 = (*I_GetTime)(false);
      testingmode = iVar2 + 0xaf;
      FSoundID::FSoundID(&local_24,"menu/choose");
      volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
      S_Sound(0x22,&local_24,volume,0.0);
      SetModesMenu(NewWidth,NewHeight,NewBits);
      return true;
    }
    NewWidth = screen->VideoWidth;
    NewHeight = screen->VideoHeight;
  }
  bVar1 = DOptionMenu::Responder(&this->super_DOptionMenu,local_20);
  return bVar1;
}

Assistant:

bool Responder(event_t *ev)
	{
		if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_KeyDown &&
			(ev->data1 == 't' || ev->data1 == 'T'))
		{
			if (!GetSelectedSize (&NewWidth, &NewHeight))
			{
				NewWidth = screen->VideoWidth;
				NewHeight = screen->VideoHeight;
			}
			else
			{
				OldWidth = screen->VideoWidth;
				OldHeight = screen->VideoHeight;
				OldBits = DisplayBits;
				NewBits = BitTranslate[DummyDepthCvar];
				setmodeneeded = true;
				testingmode = I_GetTime(false) + 5 * TICRATE;
				S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
				SetModesMenu (NewWidth, NewHeight, NewBits);
				return true;
			}
		}
		return Super::Responder(ev);
	}